

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O1

void zzSqrMod(word *b,word *a,word *mod,size_t n,void *stack)

{
  void *stack_00;
  
  stack_00 = (void *)(n * 0x10 + (long)stack);
  zzSqr((word *)stack,a,n,stack_00);
  zzMod(b,(word *)stack,n * 2,mod,n,stack_00);
  return;
}

Assistant:

void zzSqrMod(word b[], const word a[], const word mod[], size_t n,
	void* stack)
{
	word* sqr = (word*)stack;
	stack = sqr + 2 * n;
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsValid(b, n));
	ASSERT(n > 0 && mod[n - 1] != 0);
	zzSqr(sqr, a, n, stack);
	zzMod(b, sqr, 2 * n, mod, n, stack);
}